

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANN.cpp
# Opt level: O2

ANNpoint annAllocPt(int dim,ANNcoord c)

{
  ANNpoint pAVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  uVar3 = 0xffffffffffffffff;
  if (-1 < dim) {
    uVar3 = (ulong)(uint)dim << 3;
  }
  uVar2 = (ulong)(uint)dim;
  if (dim < 1) {
    uVar2 = uVar4;
  }
  pAVar1 = (ANNpoint)operator_new__(uVar3);
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    pAVar1[uVar4] = c;
  }
  return pAVar1;
}

Assistant:

ANNpoint annAllocPt(int dim, ANNcoord c)  // allocate 1 point
{
    ANNpoint p = new ANNcoord[dim];
    for (int i = 0; i < dim; i++) p[i] = c;
    return p;
}